

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true> __thiscall
duckdb::RenameViewInfo::Deserialize(RenameViewInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  RenameViewInfo *this_00;
  pointer pRVar2;
  pointer *__ptr;
  unique_ptr<duckdb::RenameViewInfo,_std::default_delete<duckdb::RenameViewInfo>,_true> result;
  _Head_base<0UL,_duckdb::RenameViewInfo_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (RenameViewInfo *)operator_new(0x98);
  RenameViewInfo(this_00);
  local_58._M_head_impl = this_00;
  pRVar2 = unique_ptr<duckdb::RenameViewInfo,_std::default_delete<duckdb::RenameViewInfo>,_true>::
           operator->((unique_ptr<duckdb::RenameViewInfo,_std::default_delete<duckdb::RenameViewInfo>,_true>
                       *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,400,"new_view_name");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pRVar2->new_view_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010bf2d3;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pRVar2->new_view_name,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010bf2d3;
  }
  operator_delete(local_50);
LAB_010bf2d3:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_AlterViewInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>_>)
         (unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>_>)this;
}

Assistant:

unique_ptr<AlterViewInfo> RenameViewInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RenameViewInfo>(new RenameViewInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "new_view_name", result->new_view_name);
	return std::move(result);
}